

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O3

void __thiscall xmrig::NetworkState::NetworkState(NetworkState *this)

{
  memset(this,0,0x179);
  (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fingerprint).m_data = (char *)0x0;
  (this->m_fingerprint).m_size = 0;
  (this->m_ip).m_data = (char *)0x0;
  (this->m_ip).m_size = 0;
  (this->m_tls).m_data = (char *)0x0;
  (this->m_tls).m_size = 0;
  return;
}

Assistant:

xmrig::NetworkState::NetworkState() :
    pool(),
    accepted(0),
    diff(0),
    failures(0),
    rejected(0),
    total(0),
    m_active(false)
{
}